

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_skipSequences(rawSeqStore_t *rawSeqStore,size_t srcSize,U32 minMatch)

{
  rawSeq *prVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  rawSeq *seq;
  size_t sStack_18;
  U32 minMatch_local;
  size_t srcSize_local;
  rawSeqStore_t *rawSeqStore_local;
  
  sStack_18 = srcSize;
  while( true ) {
    bVar4 = false;
    if (sStack_18 != 0) {
      bVar4 = rawSeqStore->pos < rawSeqStore->size;
    }
    if (!bVar4) {
      return;
    }
    prVar1 = rawSeqStore->seq;
    sVar2 = rawSeqStore->pos;
    if (sStack_18 <= prVar1[sVar2].litLength) {
      prVar1[sVar2].litLength = prVar1[sVar2].litLength - (int)sStack_18;
      return;
    }
    uVar3 = sStack_18 - prVar1[sVar2].litLength;
    prVar1[sVar2].litLength = 0;
    if (uVar3 < prVar1[sVar2].matchLength) break;
    sStack_18 = uVar3 - prVar1[sVar2].matchLength;
    prVar1[sVar2].matchLength = 0;
    rawSeqStore->pos = rawSeqStore->pos + 1;
  }
  prVar1[sVar2].matchLength = prVar1[sVar2].matchLength - (int)uVar3;
  if (prVar1[sVar2].matchLength < minMatch) {
    if (rawSeqStore->pos + 1 < rawSeqStore->size) {
      prVar1[sVar2 + 1].litLength = prVar1[sVar2].matchLength + prVar1[sVar2 + 1].litLength;
    }
    rawSeqStore->pos = rawSeqStore->pos + 1;
  }
  return;
}

Assistant:

void
ZSTD_ldm_skipSequences(rawSeqStore_t* rawSeqStore, size_t srcSize, U32 const minMatch)
{
    while (srcSize > 0 && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq* seq = rawSeqStore->seq + rawSeqStore->pos;
        if (srcSize <= seq->litLength) {
            /* Skip past srcSize literals */
            seq->litLength -= (U32)srcSize;
            return;
        }
        srcSize -= seq->litLength;
        seq->litLength = 0;
        if (srcSize < seq->matchLength) {
            /* Skip past the first srcSize of the match */
            seq->matchLength -= (U32)srcSize;
            if (seq->matchLength < minMatch) {
                /* The match is too short, omit it */
                if (rawSeqStore->pos + 1 < rawSeqStore->size) {
                    seq[1].litLength += seq[0].matchLength;
                }
                rawSeqStore->pos++;
            }
            return;
        }
        srcSize -= seq->matchLength;
        seq->matchLength = 0;
        rawSeqStore->pos++;
    }
}